

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ip_config.c
# Opt level: O1

void get_IP_config(char *hostname_buf,int len,int *IP_p,int *port_range_low_p,int *port_range_high_p
                  ,int *use_hostname_p,attr_list attrs,CMTransport_trace trace_func,void *trace_data
                  )

{
  __int32_t *p_Var1;
  int iVar2;
  int tmp;
  int iVar3;
  int iVar4;
  uint uVar5;
  char *pcVar6;
  char *pcVar7;
  hostent *phVar8;
  ushort **ppuVar9;
  __int32_t **pp_Var10;
  size_t sVar11;
  char cVar12;
  in_addr *in;
  uint *__cp;
  char *pcVar13;
  void *pvVar14;
  char **ppcVar15;
  char *iface;
  int net_byte_order;
  char hostname_to_use [256];
  in_addr addr_1;
  char *local_268;
  char *local_260;
  char *local_258;
  int *local_250;
  uint *local_248;
  uint local_23c;
  in_addr local_238 [64];
  uint local_138 [66];
  
  local_268 = (char *)0x0;
  local_250 = port_range_high_p;
  local_248 = (uint *)use_hostname_p;
  if (get_IP_config_first_call != '\0') goto LAB_00104260;
  pcVar6 = getenv("ADIOS2_HOSTNAME");
  pcVar7 = getenv("ADIOS2_IP");
  local_258 = getenv("ADIOS2_PORT_RANGE");
  CM_IP_INTERFACE = attr_atom_from_string("IP_INTERFACE");
  attr_atom_from_string("IP_PORT");
  atom_init = atom_init + 1;
  get_IP_config_first_call = '\x01';
  get_IP_config::determined_hostname[0] = '\0';
  if (pcVar7 == (char *)0x0) {
    if (pcVar6 == (char *)0x0) {
      pcVar6 = get_IP_config::determined_hostname;
      iVar3 = 0x1092d0;
      get_qual_hostname(get_IP_config::determined_hostname,0,(attr_list)trace_func,(int *)trace_data
                        ,(CMTransport_trace)port_range_high_p,use_hostname_p);
      pcVar13 = "\tADIOS2_IP_CONFIG best guess hostname is \"%s\"\n";
      goto LAB_001040b5;
    }
    get_IP_config_use_hostname = 1;
    pvVar14 = trace_data;
    (*trace_func)((CManager)trace_data,"CM<IP_CONFIG> CM_HOSTNAME set to \"%s\", running with that."
                  ,pcVar6);
    dump_output((int)pvVar14,"\tADIOS2_HOSTNAME environment variable found, trying \"%s\"\n",pcVar6)
    ;
    phVar8 = gethostbyname(pcVar6);
    pcVar7 = get_IP_config::determined_hostname;
    strcpy(get_IP_config::determined_hostname,pcVar6);
    iVar3 = (int)pcVar7;
    if (phVar8 == (hostent *)0x0) {
      iVar3 = 0x105e72;
      printf("Warning, ADIOS2_HOSTNAME is \"%s\", but gethostbyname fails for that string.\n",pcVar6
            );
      dump_output(iVar3,"\tADIOS2_HOSTNAME \"%s\" fails to translate to IP address.\n",pcVar6);
    }
    else {
      ppcVar15 = phVar8->h_addr_list;
      __cp = (uint *)*ppcVar15;
      local_260 = hostname_buf;
      if (__cp != (uint *)0x0) {
        do {
          ppcVar15 = ppcVar15 + 1;
          if ((char)*__cp != '\x7f') {
            inet_ntop(2,__cp,(char *)local_238,0x10);
            pcVar7 = (char *)trace_data;
            (*trace_func)((CManager)trace_data,
                          "CM IP_CONFIG Prefer IP associated with hostname net -> %s",local_238);
            dump_output((int)pcVar7,"\tHOSTNAME \"%s\" translates to IP address %s.\n",pcVar6,
                        local_238);
            uVar5 = *__cp;
            get_IP_config::determined_IP =
                 uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
          }
          iVar3 = (int)pcVar7;
          __cp = (uint *)*ppcVar15;
        } while (__cp != (uint *)0x0);
      }
      hostname_buf = local_260;
      if (get_IP_config::determined_IP == -1) {
        pcVar13 = "\tNo non-loopback interfaces found for hostname \"%s\", rejected for IP use.\n";
        goto LAB_001040b5;
      }
    }
  }
  else {
    if (pcVar6 != (char *)0x0) {
      puts("Warning, ADIOS2_HOSTNAME and ADIOS2_IP are both set, preferring ADIOS2_IP");
    }
    iVar3 = inet_aton(pcVar7,local_238);
    if (iVar3 == 0) {
      fprintf(_stderr,"Invalid address %s specified for ADIOS2_IP\n",pcVar7);
      goto LAB_001040bc;
    }
    pvVar14 = trace_data;
    (*trace_func)((CManager)trace_data,"CM IP_CONFIG Using IP specified in ADIOS2_IP, %s",pcVar7);
    iVar3 = (int)pvVar14;
    get_IP_config::determined_IP =
         local_238[0].s_addr >> 0x18 | (local_238[0].s_addr & 0xff0000) >> 8 |
         (local_238[0].s_addr & 0xff00) << 8 | local_238[0].s_addr << 0x18;
    pcVar13 = "\tADIOS2_IP environment variable found, preferring IP %s\n";
    pcVar6 = pcVar7;
LAB_001040b5:
    dump_output(iVar3,pcVar13,pcVar6);
  }
LAB_001040bc:
  if (get_IP_config::determined_IP == -1) {
    get_IP_config::determined_IP = get_self_ip_iface(trace_func,trace_data,(char *)0x0);
    local_138[0] = (uint)get_IP_config::determined_IP >> 0x18 |
                   (get_IP_config::determined_IP & 0xff0000U) >> 8 |
                   (get_IP_config::determined_IP & 0xff00U) << 8 |
                   get_IP_config::determined_IP << 0x18;
    iVar3 = 2;
    inet_ntop(2,local_138,(char *)local_238,0x10);
    dump_output(iVar3,"\tADIOS2_IP_CONFIG best guess IP is \"%s\"\n",local_238);
  }
  pcVar6 = "ANY";
  if (local_258 != (char *)0x0) {
    pcVar6 = local_258;
  }
  ppuVar9 = __ctype_b_loc();
  if ((*(byte *)((long)*ppuVar9 + (long)*pcVar6 * 2 + 1) & 4) == 0) {
    pcVar7 = pcVar6;
    iVar4 = __isoc99_sscanf(pcVar6,"%d:%d",&get_IP_config::port_range_high,
                            &get_IP_config::port_range_low);
    iVar2 = get_IP_config::port_range_high;
    iVar3 = (int)pcVar7;
    if (iVar4 == 2) {
      if (get_IP_config::port_range_high < get_IP_config::port_range_low) {
        get_IP_config::port_range_high = get_IP_config::port_range_low;
        get_IP_config::port_range_low = iVar2;
      }
    }
    else {
      iVar3 = 0x106009;
      printf("ADIOS2_PORT_RANGE spec not understood \"%s\"\n",pcVar6);
    }
  }
  else {
    pcVar7 = strdup(pcVar6);
    cVar12 = *pcVar7;
    if (cVar12 != '\0') {
      pp_Var10 = __ctype_tolower_loc();
      p_Var1 = *pp_Var10;
      pcVar13 = pcVar7;
      do {
        *pcVar13 = (char)p_Var1[cVar12];
        cVar12 = pcVar13[1];
        pcVar13 = pcVar13 + 1;
      } while (cVar12 != '\0');
    }
    iVar3 = strcmp(pcVar7,"any");
    if (iVar3 == 0) {
      get_IP_config::port_range_high = -1;
      get_IP_config::port_range_low = -1;
    }
    else {
      printf("ADIOS2_PORT_RANGE spec not understood \"%s\"\n",pcVar6);
    }
    free(pcVar7);
    iVar3 = (int)pcVar7;
  }
  if (get_IP_config::port_range_low == -1) {
    dump_output(iVar3,"\tADIOS2_IP_CONFIG specified port range is \"ANY\" (unspecified)\n");
  }
  else {
    dump_output(iVar3,"\tADIOS2_IP_CONFIG specified port range is %d:%d\n",
                (ulong)(uint)get_IP_config::port_range_low,
                (ulong)(uint)get_IP_config::port_range_high);
  }
LAB_00104260:
  iVar3 = get_string_attr(attrs,CM_IP_INTERFACE,&local_268);
  if (iVar3 == 0) {
    strcpy((char *)local_238,get_IP_config::determined_hostname);
    uVar5 = get_IP_config::determined_IP;
  }
  else {
    get_qual_hostname((char *)local_238,(int)attrs,(attr_list)trace_func,(int *)trace_data,
                      (CMTransport_trace)port_range_high_p,use_hostname_p);
    uVar5 = get_self_ip_iface(trace_func,trace_data,local_268);
  }
  if ((hostname_buf != (char *)0x0) &&
     (sVar11 = strlen(get_IP_config::determined_hostname), sVar11 < (ulong)(long)len)) {
    strcpy(hostname_buf,(char *)local_238);
  }
  if ((IP_p != (int *)0x0) && (get_IP_config::determined_IP != -1)) {
    *IP_p = uVar5;
  }
  if (port_range_low_p != (int *)0x0) {
    *port_range_low_p = get_IP_config::port_range_low;
  }
  if (local_250 != (int *)0x0) {
    *local_250 = get_IP_config::port_range_high;
  }
  if (local_248 != (uint *)0x0) {
    *local_248 = (uint)get_IP_config_use_hostname;
  }
  local_23c = uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
  pcVar6 = inet_ntop(2,&local_23c,(char *)local_138,0x100);
  (*trace_func)((CManager)trace_data,
                "CM<IP_CONFIG> returning hostname \"%s\", IP %s, use_hostname = %d, port range %d:%d"
                ,local_238,pcVar6,(ulong)get_IP_config_use_hostname,
                (ulong)(uint)get_IP_config::port_range_low,get_IP_config::port_range_high);
  return;
}

Assistant:

extern void
get_IP_config(char *hostname_buf, int len, int* IP_p, int *port_range_low_p, int *port_range_high_p, 
	      int *use_hostname_p, attr_list attrs, CMTransport_trace trace_func, void *trace_data)
{
    static int first_call = 1;
    static char determined_hostname[HOST_NAME_MAX+1];
    static int determined_IP = -1;
    static int port_range_low = 0, port_range_high = 0;
    static int use_hostname = 0;
    char hostname_to_use[HOST_NAME_MAX+1];
    int IP_to_use;
    char *iface = NULL;

    if (first_call) {
	char *preferred_hostname = getenv(IPCONFIG_ENVVAR_PREFIX "HOSTNAME");
	char *preferred_IP = getenv(IPCONFIG_ENVVAR_PREFIX "IP");
	char *port_range = getenv(IPCONFIG_ENVVAR_PREFIX "PORT_RANGE");
	CM_IP_INTERFACE = attr_atom_from_string("IP_INTERFACE");
	CM_IP_PORT = attr_atom_from_string("IP_PORT");
	(void) CM_IP_PORT;
	atom_init++;
	first_call = 0;
	determined_hostname[0] = 0;
	
	if (preferred_IP != NULL) {
	    struct in_addr addr;
	    if (preferred_hostname) printf("Warning, " IPCONFIG_ENVVAR_PREFIX "HOSTNAME and " IPCONFIG_ENVVAR_PREFIX "IP are both set, preferring " IPCONFIG_ENVVAR_PREFIX "IP\n");
	    if (inet_aton(preferred_IP, &addr) == 0) {
		fprintf(stderr, "Invalid address %s specified for " IPCONFIG_ENVVAR_PREFIX "IP\n", preferred_IP);
	    } else {
		trace_func(trace_data, "CM IP_CONFIG Using IP specified in " IPCONFIG_ENVVAR_PREFIX "IP, %s", preferred_IP);
		determined_IP =  (ntohl(addr.s_addr));
		dump_output(1023, "\t" IPCONFIG_ENVVAR_PREFIX "IP environment variable found, preferring IP %s\n", preferred_IP);
	    }
	} else if (preferred_hostname != NULL) {
	    struct hostent *host;
	    use_hostname = 1;
	    trace_func(trace_data, "CM<IP_CONFIG> CM_HOSTNAME set to \"%s\", running with that.", preferred_hostname);
	    dump_output(1023, "\t" IPCONFIG_ENVVAR_PREFIX "HOSTNAME environment variable found, trying \"%s\"\n", preferred_hostname);
	    host = gethostbyname(preferred_hostname);
	    strcpy(determined_hostname, preferred_hostname);
	    if (!host) {
		printf("Warning, " IPCONFIG_ENVVAR_PREFIX "HOSTNAME is \"%s\", but gethostbyname fails for that string.\n", preferred_hostname);
		dump_output(1023, "\t" IPCONFIG_ENVVAR_PREFIX "HOSTNAME \"%s\" fails to translate to IP address.\n", preferred_hostname);
	    } else {
		char **p;
		for (p = host->h_addr_list; *p != 0; p++) {
		    struct in_addr *in = *(struct in_addr **) p;
		    if (!ipv4_is_loopback(ntohl(in->s_addr))) {
		        char str[INET_ADDRSTRLEN];
					      
			inet_ntop(AF_INET, &(in->s_addr), str, sizeof(str));
			trace_func(trace_data, "CM IP_CONFIG Prefer IP associated with hostname net -> %s", str);
			dump_output(1023, "\t" "HOSTNAME \"%s\" translates to IP address %s.\n", preferred_hostname, str);
			determined_IP  = (ntohl(in->s_addr));
		    }
		}
		if (determined_IP == -1) {
		    dump_output(1023, "\t" "No non-loopback interfaces found for hostname \"%s\", rejected for IP use.\n", preferred_hostname);
		}
	    }
	} else {
	    get_qual_hostname(determined_hostname, sizeof(determined_hostname) - 1, NULL /* attrs */, NULL, trace_func, trace_data);
	    dump_output(1023, "\t" IPCONFIG_ENVVAR_PREFIX "IP_CONFIG best guess hostname is \"%s\"\n", determined_hostname);
	}
	if (determined_IP == -1) {
	    /* I.E. the specified hostname didn't determine what IP we should use */
	    char str[INET_ADDRSTRLEN];
	    struct in_addr addr;
	    determined_IP = get_self_ip_addr(trace_func, trace_data);
					      
	    addr.s_addr = ntohl(determined_IP);
	    inet_ntop(AF_INET, &(addr.s_addr), str, sizeof(str));
	    dump_output(1023, "\t" IPCONFIG_ENVVAR_PREFIX "IP_CONFIG best guess IP is \"%s\"\n", str);
	}
	if (port_range == NULL) {
	    // no getenv
	    port_range = EVPATH_DEFAULT_PORT_RANGE;
	}
	if (port_range != NULL) {
	    if (isalpha(port_range[0])) {
		char *t = strdup(port_range);
		char *lower = t;
		for ( ; *lower; ++lower) *lower = tolower(*lower);
		if (strcmp(t, "any") == 0) {
		    port_range_high = -1;
		    port_range_low = -1;
		} else {
		    printf(IPCONFIG_ENVVAR_PREFIX "PORT_RANGE spec not understood \"%s\"\n", port_range);
		}
		free(t);
	    } else {
		if (sscanf(port_range, "%d:%d", &port_range_high, &port_range_low) != 2) {
		    printf(IPCONFIG_ENVVAR_PREFIX "PORT_RANGE spec not understood \"%s\"\n", port_range);
		} else {
		    if (port_range_high < port_range_low) {
			int tmp = port_range_high;
			port_range_high = port_range_low;
			port_range_low = tmp;
		    }
		}
	    }
	}
	if (port_range_low == -1) {
	    dump_output(1023, "\t" IPCONFIG_ENVVAR_PREFIX "IP_CONFIG specified port range is \"ANY\" (unspecified)\n");
	} else {
	    dump_output(1023, "\t" IPCONFIG_ENVVAR_PREFIX "IP_CONFIG specified port range is %d:%d\n", port_range_low, port_range_high);
	}	    
    }


    if (get_string_attr(attrs, CM_IP_INTERFACE, &iface)) {
	/* don't use predetermined stuff ! */
	get_qual_hostname(hostname_to_use, sizeof(hostname_to_use) - 1 , attrs, NULL, trace_func, trace_data);
	IP_to_use = get_self_ip_iface(trace_func, trace_data, iface);
    } else {
	strcpy(hostname_to_use, determined_hostname);
	IP_to_use = determined_IP;
    }
    if (hostname_buf && (len > strlen(determined_hostname))) {
	strcpy(hostname_buf, hostname_to_use);
    }
    if (IP_p && (determined_IP != -1)) {
	*IP_p = IP_to_use;
    }
    
    if (port_range_low_p) {
	*port_range_low_p = port_range_low;
    }
    if (port_range_high_p) {
	*port_range_high_p = port_range_high;
    }
    if (use_hostname_p) {
	*use_hostname_p = use_hostname;
    }
    {
	char buf[256];
	int net_byte_order = htonl(IP_to_use);
	trace_func(trace_data, "CM<IP_CONFIG> returning hostname \"%s\", IP %s, use_hostname = %d, port range %d:%d",
		   hostname_to_use, inet_ntop(AF_INET, &net_byte_order, &buf[0], 256), use_hostname, port_range_low, port_range_high);
    }
}